

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validatedamagebin.cpp
# Opt level: O2

void __thiscall ValidateDamageBin::CheckFirstBin(ValidateDamageBin *this,bool convertToBin)

{
  float fVar1;
  
  fVar1 = (this->dbd_).bin_from;
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    fprintf(_stderr,
            "WARNING: Lower limit for first bin is not 0. Are you sure this is what you want?:\n%s\n"
            ,this);
    (this->super_Validate).warnings_ = true;
  }
  if ((this->dbd_).bin_index != 1) {
    fprintf(_stderr,"ERROR: First bin index must be 1:\n%s\n",this);
    Validate::PrintErrorMessage(&this->super_Validate);
  }
  CheckInterpolationDamageValuesWithinRange(this);
  StoreLine(this);
  if (convertToBin) {
    ConvertToBin(this);
    return;
  }
  return;
}

Assistant:

void ValidateDamageBin::CheckFirstBin(const bool convertToBin) {
/* First bin should have a bin index of 1. Additionally, in most cases the
 * lower limit for the first bin should be 0. */

  if (dbd_.bin_from != 0.0) {

    fprintf(stderr, "WARNING: Lower limit for first bin is not 0."
                    " Are you sure this is what you want?:\n%s\n",
                    line_);
    warnings_ = true;

  }

  if (dbd_.bin_index != 1) {

    fprintf(stderr, "ERROR: First bin index must be 1:\n%s\n", line_);
    PrintErrorMessage();

  }

  CheckInterpolationDamageValuesWithinRange();
  StoreLine();
  if (convertToBin) ConvertToBin();

}